

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int fs_remove(char *filename)

{
  int iVar1;
  
  iVar1 = remove(filename);
  return (int)(iVar1 != 0);
}

Assistant:

int fs_remove(const char *filename)
{
#if defined(CONF_FAMILY_WINDOWS)
	WCHAR wFilename[IO_MAX_PATH_LENGTH];
	MultiByteToWideChar(CP_UTF8, 0, filename, -1, wFilename, sizeof(wFilename) / sizeof(WCHAR));
	if(DeleteFileW(wFilename) == 0)
		return 1;
	return 0;
#else
	if(remove(filename))
		return 1;
	return 0;
#endif
}